

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

bool __thiscall
LocationToFailAllocNode::shouldFail
          (LocationToFailAllocNode *this,int allocationNumber,char *file,size_t line)

{
  int iVar1;
  long in_RCX;
  char *in_RDX;
  int in_ESI;
  int *in_RDI;
  
  if (((*(long *)(in_RDI + 2) != 0) &&
      (iVar1 = SimpleString::StrCmp(in_RDX,*(char **)(in_RDI + 2)), iVar1 == 0)) &&
     (in_RCX == *(long *)(in_RDI + 4))) {
    in_RDI[1] = in_RDI[1] + 1;
    return in_RDI[1] == *in_RDI;
  }
  return in_ESI == *in_RDI;
}

Assistant:

bool shouldFail(int allocationNumber, const char* file, size_t line)
    {
      if (file_ && SimpleString::StrCmp(file, file_) == 0 && line == line_) {
        actualAllocNumber_++;
        return actualAllocNumber_ == allocNumberToFail_;
      }
      if (allocationNumber == allocNumberToFail_)
        return true;
      return false;
    }